

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Return_Button.H
# Opt level: O1

void __thiscall Fl_Return_Button::~Fl_Return_Button(Fl_Return_Button *this)

{
  Fl_Widget::~Fl_Widget((Fl_Widget *)this);
  operator_delete(this,0x80);
  return;
}

Assistant:

class FL_EXPORT Fl_Return_Button : public Fl_Button {
protected:
  void draw();
public:
  int handle(int);
  /**
    Creates a new Fl_Return_Button widget using the given
    position, size, and label string. The default boxtype is FL_UP_BOX.
    <P> The inherited destructor deletes the button.
  */
  Fl_Return_Button(int X, int Y, int W, int H,const char *l=0);
}